

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

void __thiscall AllDiffBounds<0>::check(AllDiffBounds<0> *this)

{
  check((AllDiffBounds<0> *)&this[-1].d);
  return;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}